

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.cc
# Opt level: O3

void __thiscall
xemmai::t_type_of<xemmai::t_fiber>::f_do_instantiate
          (t_type_of<xemmai::t_fiber> *this,t_pvalue *a_stack,size_t a_n)

{
  t_object *p;
  t_object *ptVar1;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *paVar2;
  wchar_t *extraout_RDX;
  long in_FS_OFFSET;
  wstring_view a_message;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 local_10;
  
  if (a_n - 3 < 0xfffffffffffffffe) {
LAB_00134436:
    a_message._M_str = (wchar_t *)a_n;
    a_message._M_len = (size_t)L"must be called with 1 or 2 argument(s).";
    f_throw((xemmai *)0x27,a_message);
  }
  if (a_n == 2) {
    ptVar1 = a_stack[3].super_t_pointer.v_p;
    if ((ptVar1 != (t_object *)0x3) &&
       ((((ptVar1 < (t_object *)0x3 || (ptVar1 == (t_object *)0x4)) ||
         (ptVar1->v_type->v_depth == 0)) ||
        ((undefined8 *)ptVar1->v_type->v_ids[1] != &v__type_id<long>)))) {
      f_do_instantiate();
      a_n = (size_t)extraout_RDX;
      goto LAB_00134436;
    }
    paVar2 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)ptVar1->v_data;
    if (ptVar1 < (t_object *)0x5) {
      paVar2 = &a_stack[3].field_0;
    }
  }
  else {
    paVar2 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)
             (*(long *)(in_FS_OFFSET + -0x60) + 0x4c8);
  }
  local_10 = *paVar2;
  ptVar1 = t_type_of<xemmai::t_object>::
           f_new<xemmai::t_fiber,xemmai::t_value<xemmai::t_pointer>const&,unsigned_long&>
                     (*(t_type_of<xemmai::t_object> **)(*(long *)(in_FS_OFFSET + -0x78) + 0xb8),
                      a_stack + 2,(unsigned_long *)&local_10.v_integer);
  (a_stack->super_t_pointer).v_p = ptVar1;
  return;
}

Assistant:

void t_type_of<t_fiber>::f_do_instantiate(t_pvalue* a_stack, size_t a_n)
{
	if (a_n != 1 && a_n != 2) f_throw(L"must be called with 1 or 2 argument(s)."sv);
	auto size = f_engine()->v_options.v_stack_size;
	if (a_n == 2) {
		f_check<size_t>(a_stack[3], L"argument1");
		size = f_as<size_t>(a_stack[3]);
	}
	a_stack[0] = t_fiber::f_instantiate(a_stack[2], size);
}